

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

string * __thiscall
spvtools::opt::Function::PrettyPrint_abi_cxx11_
          (string *__return_storage_ptr__,Function *this,uint32_t options)

{
  ostringstream str;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1c8._12_4_ = 0;
  local_1c8._8_4_ = options;
  pcStack_1b0 = std::
                _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/function.cpp:263:15)>
                ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/function.cpp:263:15)>
              ::_M_manager;
  local_1c8._M_unused._0_8_ = (undefined8)local_1a0;
  ForEachInst(this,(function<void_(const_spvtools::opt::Instruction_*)> *)&local_1c8,false,false);
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string Function::PrettyPrint(uint32_t options) const {
  std::ostringstream str;
  ForEachInst([&str, options](const Instruction* inst) {
    str << inst->PrettyPrint(options);
    if (inst->opcode() != spv::Op::OpFunctionEnd) {
      str << std::endl;
    }
  });
  return str.str();
}